

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

int ON_UuidIndex::CompareIdAndIndex(ON_UuidIndex *a,ON_UuidIndex *b)

{
  int local_24;
  int i;
  ON_UuidIndex *b_local;
  ON_UuidIndex *a_local;
  
  if (a == (ON_UuidIndex *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_UuidIndex *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_UuidIndex *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    local_24 = ON_UuidCompare(&a->m_id,&b->m_id);
    if (local_24 == 0) {
      if (a->m_i < b->m_i) {
        local_24 = -1;
      }
      else if (b->m_i < a->m_i) {
        local_24 = 1;
      }
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ON_UuidIndex::CompareIdAndIndex( const ON_UuidIndex* a, const ON_UuidIndex* b )
{
  int i;
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;

  // compare id first
  if (0 == (i = ON_UuidCompare(&a->m_id, &b->m_id)))
  {
    if (a->m_i < b->m_i)
      i = -1;
    else if (a->m_i > b->m_i)
      i = 1;
  }

  return i;
}